

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_named_node_iterator * __thiscall
pugi::xml_named_node_iterator::operator--(xml_named_node_iterator *this)

{
  bool bVar1;
  xml_node_struct *pxVar2;
  xml_node xVar3;
  char *src;
  
  if ((this->_wrap)._root == (xml_node_struct *)0x0) {
    pxVar2 = (this->_parent)._root;
    if ((pxVar2 == (xml_node_struct *)0x0) ||
       (pxVar2 = pxVar2->first_child, pxVar2 == (xml_node_struct *)0x0)) {
      pxVar2 = (xml_node_struct *)0x0;
    }
    else {
      pxVar2 = pxVar2->prev_sibling_c;
    }
    (this->_wrap)._root = pxVar2;
    if (pxVar2 == (xml_node_struct *)0x0) {
      src = "";
    }
    else {
      src = "";
      if (pxVar2->name != (char_t *)0x0) {
        src = pxVar2->name;
      }
    }
    bVar1 = impl::anon_unknown_0::strequal(src,this->_name);
    if (bVar1) {
      return this;
    }
  }
  xVar3 = xml_node::previous_sibling(&this->_wrap,this->_name);
  (this->_wrap)._root = xVar3._root;
  return this;
}

Assistant:

PUGI__FN xml_named_node_iterator& xml_named_node_iterator::operator--()
	{
		if (_wrap._root)
			_wrap = _wrap.previous_sibling(_name);
		else
		{
			_wrap = _parent.last_child();

			if (!impl::strequal(_wrap.name(), _name))
				_wrap = _wrap.previous_sibling(_name);
		}

		return *this;
	}